

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Execute<long,duckdb::hugeint_t,duckdb::ArgMinMaxState<long,duckdb::hugeint_t>>
               (ArgMinMaxState<long,_duckdb::hugeint_t> *state,long x_data,hugeint_t y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  ArgMinMaxState<long,_duckdb::hugeint_t> *in_RDX;
  hugeint_t *in_RSI;
  long *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  hugeint_t *in_stack_ffffffffffffffc8;
  hugeint_t *in_stack_ffffffffffffffd0;
  
  bVar1 = LessThan::Operation<duckdb::hugeint_t>
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_R8,(idx_t)in_RDI);
    Assign<long,duckdb::hugeint_t,duckdb::ArgMinMaxState<long,duckdb::hugeint_t>>
              (in_RDX,in_RDI,in_RSI,SUB81((ulong)in_R8 >> 0x38,0));
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}